

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O1

drmp3_bool32
drmp3_bind_seek_table(drmp3 *pMP3,drmp3_uint32 seekPointCount,drmp3_seek_point *pSeekPoints)

{
  drmp3_seek_point *pdVar1;
  drmp3_uint32 dVar2;
  
  if (pMP3 != (drmp3 *)0x0) {
    dVar2 = seekPointCount;
    if (pSeekPoints == (drmp3_seek_point *)0x0) {
      dVar2 = 0;
    }
    pdVar1 = (drmp3_seek_point *)0x0;
    if (seekPointCount != 0) {
      pdVar1 = pSeekPoints;
    }
    pMP3->seekPointCount = dVar2;
    pMP3->pSeekPoints = pdVar1;
    return 1;
  }
  return 0;
}

Assistant:

drmp3_bool32 drmp3_bind_seek_table(drmp3* pMP3, drmp3_uint32 seekPointCount, drmp3_seek_point* pSeekPoints)
{
    if (pMP3 == NULL) {
        return DRMP3_FALSE;
    }

    if (seekPointCount == 0 || pSeekPoints == NULL) {
        // Unbinding.
        pMP3->seekPointCount = 0;
        pMP3->pSeekPoints = NULL;
    } else {
        // Binding.
        pMP3->seekPointCount = seekPointCount;
        pMP3->pSeekPoints = pSeekPoints;
    }

    return DRMP3_TRUE;
}